

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

void __thiscall menuwindow::draw(menuwindow *this)

{
  char *pcVar1;
  Fl_Menu_Item *pFVar2;
  menuwindow *pmVar3;
  int iVar4;
  
  if ((this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.damage_ == '\x01') {
    iVar4 = this->drawn_selected;
    if (this->selected != iVar4) {
      pFVar2 = Fl_Menu_Item::next(this->menu,iVar4);
      drawentry(this,pFVar2,iVar4,1);
      iVar4 = this->selected;
      pFVar2 = Fl_Menu_Item::next(this->menu,iVar4);
      drawentry(this,pFVar2,iVar4,1);
    }
  }
  else {
    pmVar3 = (menuwindow *)button;
    if (button == (Fl_Menu_ *)0x0) {
      pmVar3 = this;
    }
    fl_draw_box((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                      super_Fl_Group.super_Fl_Widget.box_,0,0,
                (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                super_Fl_Widget.w_,
                (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                super_Fl_Widget.h_,
                (pmVar3->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget.color_);
    if (this->menu != (Fl_Menu_Item *)0x0) {
      iVar4 = 0;
      pFVar2 = Fl_Menu_Item::next(this->menu,0);
      pcVar1 = pFVar2->text;
      while (pcVar1 != (char *)0x0) {
        drawentry(this,pFVar2,iVar4,0);
        iVar4 = iVar4 + 1;
        pFVar2 = Fl_Menu_Item::next(pFVar2,1);
        pcVar1 = pFVar2->text;
      }
    }
  }
  this->drawn_selected = this->selected;
  return;
}

Assistant:

void menuwindow::draw() {
  if (damage() != FL_DAMAGE_CHILD) {	// complete redraw
    fl_draw_box(box(), 0, 0, w(), h(), button ? button->color() : color());
    if (menu) {
      const Fl_Menu_Item* m; int j;
      for (m=menu->first(), j=0; m->text; j++, m = m->next()) drawentry(m, j, 0);
    }
  } else {
    if (damage() & FL_DAMAGE_CHILD && selected!=drawn_selected) { // change selection
      drawentry(menu->next(drawn_selected), drawn_selected, 1);
      drawentry(menu->next(selected), selected, 1);
    }
  }	    
  drawn_selected = selected;
}